

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O2

uint32_t svb_select_avx_d1_init
                   (uint8_t *keyPtr,uint8_t *dataPtr,uint64_t count,uint32_t prev,int slot)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uint32_t uVar5;
  byte bVar7;
  ulong uVar6;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  xmm_t local_58;
  xmm_t PrevLow;
  
  iVar4 = 0;
  if (0x1f < count) {
    local_58 = (xmm_t)vpbroadcastd_avx512vl();
    uVar9 = 1;
    iVar4 = 0;
    uVar6 = *(ulong *)keyPtr;
    while( true ) {
      auVar15 = vpshufd_avx((undefined1  [16])local_58,0xff);
      bVar7 = (byte)(uVar6 >> 8);
      iVar10 = iVar4;
      if (count >> 5 == uVar9) break;
      lVar1 = uVar9 * 8;
      if (uVar6 == 0) {
        auVar14 = vlddqu_avx(*(undefined1 (*) [16])dataPtr);
        auVar14 = vpmovzxbw_avx(auVar14);
        auVar16 = vpslldq_avx(auVar14,2);
        auVar14 = vpaddd_avx(auVar16,auVar14);
        auVar16 = vpslldq_avx(auVar14,4);
        auVar14 = vpaddd_avx(auVar14,auVar16);
        auVar16 = vpmovzxwd_avx(auVar14);
        auVar14 = vpunpckhwd_avx(auVar14,(undefined1  [16])0x0);
        PrevLow = (xmm_t)vpaddd_avx(auVar15,auVar16);
        local_58 = (xmm_t)vpaddd_avx((undefined1  [16])PrevLow,auVar14);
        if (slot < iVar4 + 8) goto LAB_0013a8a9;
        auVar15 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + 8));
        auVar16 = vpshufd_avx((undefined1  [16])local_58,0xff);
        auVar15 = vpmovzxbw_avx(auVar15);
        auVar14 = vpslldq_avx(auVar15,2);
        auVar15 = vpaddd_avx(auVar14,auVar15);
        auVar14 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar15,auVar14);
        auVar14 = vpmovzxwd_avx(auVar15);
        auVar15 = vpunpckhwd_avx(auVar15,(undefined1  [16])0x0);
        PrevLow = (xmm_t)vpaddd_avx(auVar16,auVar14);
        local_58 = (xmm_t)vpaddd_avx((undefined1  [16])PrevLow,auVar15);
        iVar10 = iVar4 + 8;
        if (slot < iVar4 + 0x10) goto LAB_0013a8a9;
        auVar15 = vlddqu_avx(*(undefined1 (*) [16])((long)dataPtr + 0x10));
        auVar16 = vpshufd_avx((undefined1  [16])local_58,0xff);
        auVar15 = vpmovzxbw_avx(auVar15);
        auVar14 = vpslldq_avx(auVar15,2);
        auVar15 = vpaddd_avx(auVar14,auVar15);
        auVar14 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar15,auVar14);
        auVar14 = vpmovzxwd_avx(auVar15);
        auVar15 = vpunpckhwd_avx(auVar15,(undefined1  [16])0x0);
        PrevLow = (xmm_t)vpaddd_avx(auVar16,auVar14);
        local_58 = (xmm_t)vpaddd_avx((undefined1  [16])PrevLow,auVar15);
        iVar10 = iVar4 + 0x10;
        if (slot < iVar4 + 0x18) goto LAB_0013a8a9;
        auVar15 = vlddqu_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])((long)dataPtr + 0x10) + 8));
        auVar16 = vpshufd_avx((undefined1  [16])local_58,0xff);
        auVar15 = vpmovzxbw_avx(auVar15);
        auVar14 = vpslldq_avx(auVar15,2);
        auVar15 = vpaddd_avx(auVar14,auVar15);
        auVar14 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar15,auVar14);
        auVar14 = vpmovzxwd_avx(auVar15);
        auVar15 = vpunpckhwd_avx(auVar15,(undefined1  [16])0x0);
        PrevLow = (xmm_t)vpaddd_avx(auVar16,auVar14);
        local_58 = (xmm_t)vpaddd_avx((undefined1  [16])PrevLow,auVar15);
        iVar10 = iVar4 + 0x18;
        if (slot < iVar4 + 0x20) goto LAB_0013a8a9;
        dataPtr = (uint8_t *)((long)dataPtr + 0x20);
      }
      else {
        uVar11 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                        [uVar6 & 0xff];
        auVar14 = vpshufb_avx(*(undefined1 (*) [16])dataPtr,
                              *(undefined1 (*) [16])
                               (shuffleTable[0] + (uint)((int)(uVar6 & 0xff) << 4)));
        auVar16 = vpslldq_avx(auVar14,4);
        auVar14 = vpaddd_avx(auVar16,auVar14);
        auVar15 = vpaddd_avx(auVar14,auVar15);
        auVar14 = vpslldq_avx(auVar14,8);
        PrevLow = (xmm_t)vpaddd_avx(auVar15,auVar14);
        auVar14 = vpshufd_avx((undefined1  [16])PrevLow,0xff);
        auVar15 = vpshufb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + uVar11),
                              (undefined1  [16])shuffleTable[bVar7]);
        auVar16 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar16,auVar15);
        auVar14 = vpaddd_avx(auVar15,auVar14);
        auVar15 = vpslldq_avx(auVar15,8);
        local_58 = (xmm_t)vpaddd_avx(auVar14,auVar15);
        if (slot < iVar4 + 8) goto LAB_0013a8a9;
        auVar14 = vpshufd_avx((undefined1  [16])local_58,0xff);
        uVar8 = (uint)uVar6 >> 0x10 & 0xff;
        lVar2 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                [bVar7] + uVar11;
        uVar13 = uVar6 >> 0x18 & 0xff;
        auVar15 = vpshufb_avx(*(undefined1 (*) [16])
                               (*(undefined1 (*) [16])dataPtr +
                               "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                               [bVar7] + uVar11),
                              *(undefined1 (*) [16])(shuffleTable[0] + (uVar8 << 4)));
        auVar16 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar16,auVar15);
        auVar16 = vpslldq_avx(auVar15,8);
        auVar15 = vpaddd_avx(auVar15,auVar16);
        PrevLow = (xmm_t)vpaddd_avx(auVar15,auVar14);
        auVar14 = vpshufd_avx((undefined1  [16])PrevLow,0xff);
        auVar15 = vpshufb_avx(*(undefined1 (*) [16])
                               (*(undefined1 (*) [16])dataPtr +
                               (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                      [uVar8] + lVar2),
                              *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar13 << 4)));
        auVar16 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar16,auVar15);
        auVar16 = vpslldq_avx(auVar15,8);
        auVar15 = vpaddd_avx(auVar15,auVar16);
        local_58 = (xmm_t)vpaddd_avx(auVar15,auVar14);
        iVar10 = iVar4 + 8;
        if (slot < iVar4 + 0x10) goto LAB_0013a8a9;
        lVar2 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                       [uVar8] + lVar2;
        auVar14 = vpshufd_avx((undefined1  [16])local_58,0xff);
        uVar11 = uVar6 >> 0x20 & 0xff;
        lVar3 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                       [uVar13] + lVar2;
        uVar12 = uVar6 >> 0x28 & 0xff;
        auVar15 = vpshufb_avx(*(undefined1 (*) [16])
                               (*(undefined1 (*) [16])dataPtr +
                               (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                      [uVar13] + lVar2),
                              *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar11 << 4)));
        auVar16 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar16,auVar15);
        auVar16 = vpslldq_avx(auVar15,8);
        auVar15 = vpaddd_avx(auVar15,auVar16);
        PrevLow = (xmm_t)vpaddd_avx(auVar15,auVar14);
        auVar14 = vpshufd_avx((undefined1  [16])PrevLow,0xff);
        auVar15 = vpshufb_avx(*(undefined1 (*) [16])
                               (*(undefined1 (*) [16])dataPtr +
                               (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                      [uVar11] + lVar3),
                              *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar12 << 4)));
        auVar16 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar16,auVar15);
        auVar16 = vpslldq_avx(auVar15,8);
        auVar15 = vpaddd_avx(auVar15,auVar16);
        local_58 = (xmm_t)vpaddd_avx(auVar15,auVar14);
        iVar10 = iVar4 + 0x10;
        if (slot < iVar4 + 0x18) goto LAB_0013a8a9;
        lVar3 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                       [uVar11] + lVar3;
        auVar14 = vpshufd_avx((undefined1  [16])local_58,0xff);
        uVar11 = uVar6 >> 0x30 & 0xff;
        lVar2 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                       [uVar12] + lVar3;
        auVar15 = vpshufb_avx(*(undefined1 (*) [16])
                               (*(undefined1 (*) [16])dataPtr +
                               (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                      [uVar12] + lVar3),
                              *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar11 << 4)));
        auVar16 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar16,auVar15);
        auVar16 = vpslldq_avx(auVar15,8);
        auVar15 = vpaddd_avx(auVar15,auVar16);
        PrevLow = (xmm_t)vpaddd_avx(auVar15,auVar14);
        auVar14 = vpshufd_avx((undefined1  [16])PrevLow,0xff);
        auVar15 = vpshufb_avx(*(undefined1 (*) [16])
                               (*(undefined1 (*) [16])dataPtr +
                               (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                      [uVar11] + lVar2),
                              (undefined1  [16])shuffleTable[uVar6 >> 0x38]);
        auVar16 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar16,auVar15);
        auVar16 = vpslldq_avx(auVar15,8);
        auVar15 = vpaddd_avx(auVar15,auVar16);
        local_58 = (xmm_t)vpaddd_avx(auVar15,auVar14);
        iVar10 = iVar4 + 0x18;
        if (slot < iVar4 + 0x20) goto LAB_0013a8a9;
        dataPtr = *(undefined1 (*) [16])dataPtr +
                  (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                         [uVar11] +
                  (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                         [uVar6 >> 0x38] + lVar2;
      }
      iVar4 = iVar4 + 0x20;
      uVar9 = uVar9 + 1;
      uVar6 = *(ulong *)(keyPtr + lVar1);
    }
    if (uVar6 == 0) {
      auVar14 = vlddqu_avx(*(undefined1 (*) [16])dataPtr);
      auVar14 = vpmovzxbw_avx(auVar14);
      auVar16 = vpslldq_avx(auVar14,2);
      auVar14 = vpaddd_avx(auVar16,auVar14);
      auVar16 = vpslldq_avx(auVar14,4);
      auVar14 = vpaddd_avx(auVar14,auVar16);
      auVar16 = vpmovzxwd_avx(auVar14);
      PrevLow = (xmm_t)vpaddd_avx(auVar15,auVar16);
      auVar15 = vpunpckhwd_avx(auVar14,(undefined1  [16])0x0);
      local_58 = (xmm_t)vpaddd_avx((undefined1  [16])PrevLow,auVar15);
      if (slot < iVar4 + 8) goto LAB_0013a8a9;
      auVar15 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + 8));
      auVar16 = vpshufd_avx((undefined1  [16])local_58,0xff);
      auVar15 = vpmovzxbw_avx(auVar15);
      auVar14 = vpslldq_avx(auVar15,2);
      auVar15 = vpaddd_avx(auVar14,auVar15);
      auVar14 = vpslldq_avx(auVar15,4);
      auVar15 = vpaddd_avx(auVar15,auVar14);
      auVar14 = vpmovzxwd_avx(auVar15);
      auVar15 = vpunpckhwd_avx(auVar15,(undefined1  [16])0x0);
      PrevLow = (xmm_t)vpaddd_avx(auVar16,auVar14);
      local_58 = (xmm_t)vpaddd_avx((undefined1  [16])PrevLow,auVar15);
      iVar10 = iVar4 + 8;
      if (slot < iVar4 + 0x10) goto LAB_0013a8a9;
      auVar15 = vlddqu_avx(*(undefined1 (*) [16])((long)dataPtr + 0x10));
      auVar16 = vpshufd_avx((undefined1  [16])local_58,0xff);
      auVar15 = vpmovzxbw_avx(auVar15);
      auVar14 = vpslldq_avx(auVar15,2);
      auVar15 = vpaddd_avx(auVar14,auVar15);
      auVar14 = vpslldq_avx(auVar15,4);
      auVar15 = vpaddd_avx(auVar15,auVar14);
      auVar14 = vpmovzxwd_avx(auVar15);
      PrevLow = (xmm_t)vpaddd_avx(auVar16,auVar14);
      auVar15 = vpunpckhwd_avx(auVar15,(undefined1  [16])0x0);
      local_58 = (xmm_t)vpaddd_avx((undefined1  [16])PrevLow,auVar15);
      iVar10 = iVar4 + 0x10;
      if (slot < iVar4 + 0x18) goto LAB_0013a8a9;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = *(ulong *)(*(undefined1 (*) [16])((long)dataPtr + 0x10) + 8);
      auVar15 = vpmovzxbw_avx(auVar15);
      auVar16 = vpshufd_avx((undefined1  [16])local_58,0xff);
      auVar14 = vpslldq_avx(auVar15,2);
      auVar15 = vpaddd_avx(auVar14,auVar15);
      auVar14 = vpslldq_avx(auVar15,4);
      auVar15 = vpaddd_avx(auVar15,auVar14);
      auVar14 = vpmovzxwd_avx(auVar15);
      auVar15 = vpunpckhwd_avx(auVar15,(undefined1  [16])0x0);
      PrevLow = (xmm_t)vpaddd_avx(auVar16,auVar14);
      local_58 = (xmm_t)vpaddd_avx((undefined1  [16])PrevLow,auVar15);
      iVar10 = iVar4 + 0x18;
      if (slot < iVar4 + 0x20) goto LAB_0013a8a9;
      prev = local_58[1]._4_4_;
      dataPtr = (uint8_t *)((long)dataPtr + 0x20);
    }
    else {
      uVar9 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                     [uVar6 & 0xff];
      auVar14 = vpshufb_avx(*(undefined1 (*) [16])dataPtr,
                            *(undefined1 (*) [16])
                             (shuffleTable[0] + (uint)((int)(uVar6 & 0xff) << 4)));
      auVar16 = vpslldq_avx(auVar14,4);
      auVar14 = vpaddd_avx(auVar16,auVar14);
      auVar15 = vpaddd_avx(auVar14,auVar15);
      auVar14 = vpslldq_avx(auVar14,8);
      PrevLow = (xmm_t)vpaddd_avx(auVar15,auVar14);
      auVar14 = vpshufd_avx((undefined1  [16])PrevLow,0xff);
      auVar15 = vpshufb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + uVar9),
                            (undefined1  [16])shuffleTable[bVar7]);
      auVar16 = vpslldq_avx(auVar15,4);
      auVar15 = vpaddd_avx(auVar16,auVar15);
      auVar14 = vpaddd_avx(auVar15,auVar14);
      auVar15 = vpslldq_avx(auVar15,8);
      local_58 = (xmm_t)vpaddd_avx(auVar14,auVar15);
      if (slot < iVar4 + 8) {
LAB_0013a8a9:
        uVar5 = _extract_from_xmm(&local_58,&PrevLow,slot - iVar10);
        return uVar5;
      }
      auVar14 = vpshufd_avx((undefined1  [16])local_58,0xff);
      uVar8 = (uint)uVar6 >> 0x10 & 0xff;
      lVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
              [bVar7] + uVar9;
      uVar11 = uVar6 >> 0x18 & 0xff;
      auVar15 = vpshufb_avx(*(undefined1 (*) [16])
                             (*(undefined1 (*) [16])dataPtr +
                             "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                             [bVar7] + uVar9),*(undefined1 (*) [16])(shuffleTable[0] + (uVar8 << 4))
                           );
      auVar16 = vpslldq_avx(auVar15,4);
      auVar15 = vpaddd_avx(auVar16,auVar15);
      auVar16 = vpslldq_avx(auVar15,8);
      auVar15 = vpaddd_avx(auVar15,auVar16);
      PrevLow = (xmm_t)vpaddd_avx(auVar15,auVar14);
      auVar14 = vpshufd_avx((undefined1  [16])PrevLow,0xff);
      auVar15 = vpshufb_avx(*(undefined1 (*) [16])
                             (*(undefined1 (*) [16])dataPtr +
                             (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                    [uVar8] + lVar1),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar11 << 4)));
      auVar16 = vpslldq_avx(auVar15,4);
      auVar15 = vpaddd_avx(auVar16,auVar15);
      auVar16 = vpslldq_avx(auVar15,8);
      auVar15 = vpaddd_avx(auVar15,auVar16);
      local_58 = (xmm_t)vpaddd_avx(auVar15,auVar14);
      iVar10 = iVar4 + 8;
      if (slot < iVar4 + 0x10) goto LAB_0013a8a9;
      lVar1 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                     [uVar8] + lVar1;
      auVar14 = vpshufd_avx((undefined1  [16])local_58,0xff);
      uVar13 = uVar6 >> 0x20 & 0xff;
      lVar2 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                     [uVar11] + lVar1;
      uVar9 = uVar6 >> 0x28 & 0xff;
      auVar15 = vpshufb_avx(*(undefined1 (*) [16])
                             (*(undefined1 (*) [16])dataPtr +
                             (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                    [uVar11] + lVar1),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar13 << 4)));
      auVar16 = vpslldq_avx(auVar15,4);
      auVar15 = vpaddd_avx(auVar16,auVar15);
      auVar16 = vpslldq_avx(auVar15,8);
      auVar15 = vpaddd_avx(auVar15,auVar16);
      PrevLow = (xmm_t)vpaddd_avx(auVar15,auVar14);
      auVar14 = vpshufd_avx((undefined1  [16])PrevLow,0xff);
      auVar15 = vpshufb_avx(*(undefined1 (*) [16])
                             (*(undefined1 (*) [16])dataPtr +
                             (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                    [uVar13] + lVar2),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar9 << 4)));
      auVar16 = vpslldq_avx(auVar15,4);
      auVar15 = vpaddd_avx(auVar16,auVar15);
      auVar16 = vpslldq_avx(auVar15,8);
      auVar15 = vpaddd_avx(auVar15,auVar16);
      local_58 = (xmm_t)vpaddd_avx(auVar15,auVar14);
      iVar10 = iVar4 + 0x10;
      if (slot < iVar4 + 0x18) goto LAB_0013a8a9;
      lVar2 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                     [uVar13] + lVar2;
      auVar14 = vpshufd_avx((undefined1  [16])local_58,0xff);
      uVar11 = uVar6 >> 0x30 & 0xff;
      lVar1 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                     [uVar9] + lVar2;
      auVar15 = vpshufb_avx(*(undefined1 (*) [16])
                             (*(undefined1 (*) [16])dataPtr +
                             (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                    [uVar9] + lVar2),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar11 << 4)));
      auVar16 = vpslldq_avx(auVar15,4);
      auVar15 = vpaddd_avx(auVar16,auVar15);
      auVar16 = vpslldq_avx(auVar15,8);
      auVar15 = vpaddd_avx(auVar15,auVar16);
      PrevLow = (xmm_t)vpaddd_avx(auVar15,auVar14);
      auVar14 = vpshufd_avx((undefined1  [16])PrevLow,0xff);
      auVar15 = vpshufb_avx(*(undefined1 (*) [16])
                             (*(undefined1 (*) [16])dataPtr +
                             (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                    [uVar11] + lVar1),(undefined1  [16])shuffleTable[uVar6 >> 0x38])
      ;
      auVar16 = vpslldq_avx(auVar15,4);
      auVar15 = vpaddd_avx(auVar16,auVar15);
      auVar16 = vpslldq_avx(auVar15,8);
      auVar15 = vpaddd_avx(auVar15,auVar16);
      local_58 = (xmm_t)vpaddd_avx(auVar15,auVar14);
      iVar10 = iVar4 + 0x18;
      if (slot < iVar4 + 0x20) goto LAB_0013a8a9;
      prev = local_58[1]._4_4_;
      dataPtr = *(undefined1 (*) [16])dataPtr +
                (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                       [uVar11] +
                (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                       [uVar6 >> 0x38] + lVar1;
    }
    iVar4 = iVar4 + 0x20;
  }
  uVar9 = count >> 2 & 0xfffffffffffffff8;
  uVar5 = svb_select_scalar_d1_init(keyPtr + uVar9,dataPtr,uVar9,prev,slot - iVar4);
  return uVar5;
}

Assistant:

uint32_t svb_select_avx_d1_init(uint8_t *keyPtr, uint8_t *dataPtr,
                                uint64_t count, uint32_t prev, int slot) {
  uint64_t keybytes = count / 4; // number of key bytes
  int consumedInts = 0;

  // make sure that the loop is run at least once
  if (keybytes >= 8) {
    xmm_t PrevHi = _mm_set1_epi32(prev);
    xmm_t PrevLow;
    xmm_t Data;

    int64_t Offset = -(int64_t)keybytes / 8 + 1;

    const uint64_t *keyPtr64 = (const uint64_t *)keyPtr - Offset;
    uint64_t nextkeys = keyPtr64[Offset];
    for (; Offset != 0; ++Offset) {
      uint64_t keys = nextkeys;
      nextkeys = keyPtr64[Offset + 1];
      // faster 16-bit delta since we only have 8-bit values
      if (!keys) { // 32 1-byte ints in a row

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 8)
          return _extract_from_xmm(&PrevHi, &PrevLow, slot - consumedInts);

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 8)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 16)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 8));

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 16)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 24)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 16));

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 24)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 32)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 24));

        dataPtr += 32;
        consumedInts += 32;
        continue;
      }

      Data = _decode_avx(keys & 0x00FF, &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (slot < consumedInts + 8)
        return _extract_from_xmm(&PrevHi, &PrevLow, slot - consumedInts);

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (slot < consumedInts + 16)
        return _extract_from_xmm(&PrevHi, &PrevLow, slot - (consumedInts + 8));

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (slot < consumedInts + 24)
        return _extract_from_xmm(&PrevHi, &PrevLow, slot - (consumedInts + 16));

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (slot < consumedInts + 32)
        return _extract_from_xmm(&PrevHi, &PrevLow, slot - (consumedInts + 24));

      consumedInts += 32;
    }

    {
      uint64_t keys = nextkeys;
      // faster 16-bit delta since we only have 8-bit values
      if (!keys) { // 32 1-byte ints in a row
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 8)
          return _extract_from_xmm(&PrevHi, &PrevLow, slot - consumedInts);

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 8)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 16)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 8));

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 16)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 24)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 16));

        Data = _mm_cvtepu8_epi16(_mm_loadl_epi64((xmm_t *)(dataPtr + 24)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 32)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 24));

        dataPtr += 32;
        consumedInts += 32;

      } else {

        Data = _decode_avx(keys & 0x00FF, &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (slot < consumedInts + 8)
          return _extract_from_xmm(&PrevHi, &PrevLow, slot - consumedInts);

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (slot < consumedInts + 16)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 8));

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (slot < consumedInts + 24)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 16));

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (slot < consumedInts + 32)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 24));

        consumedInts += 32;
      }
      // extract the highest integer which was stored so far;
      // it will be the "prev" value for the remaining data
      prev = (uint32_t)_mm_extract_epi32(PrevHi, 3);
    }
  }
  uint64_t consumedkeys = keybytes - (keybytes & 7);
  uint32_t keysleft = count & 31;
  return svb_select_scalar_d1_init(keyPtr + consumedkeys, dataPtr, keysleft,
                                   prev, slot - consumedInts);
}